

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

double __thiscall soplex::SPxLPBase<double>::minAbsNzo(SPxLPBase<double> *this,bool unscaled)

{
  double *pdVar1;
  int i;
  uint uVar2;
  undefined7 in_register_00000031;
  int i_1;
  long lVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  double local_20;
  
  pdVar1 = (double *)infinity();
  local_20 = *pdVar1;
  if (((int)CONCAT71(in_register_00000031,unscaled) == 0) || (this->_isScaled != true)) {
    for (lVar3 = 0; lVar3 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
        lVar3 = lVar3 + 1) {
      dVar4 = SVectorBase<double>::minAbs
                        ((SVectorBase<double> *)
                         ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                         (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
                         [lVar3].idx));
      if (local_20 <= dVar4) {
        dVar4 = local_20;
      }
      local_20 = dVar4;
    }
  }
  else {
    for (uVar2 = 0;
        (int)uVar2 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
        uVar2 = uVar2 + 1) {
      (*this->lp_scaler->_vptr_SPxScaler[0x13])(this->lp_scaler,this,(ulong)uVar2);
      dVar4 = extraout_XMM0_Qa;
      if (local_20 <= extraout_XMM0_Qa) {
        dVar4 = local_20;
      }
      local_20 = dVar4;
    }
  }
  return local_20;
}

Assistant:

inline
R SPxLPBase<R>::minAbsNzo(bool unscaled) const
{
   R mini = R(infinity);

   if(unscaled && _isScaled)
   {
      assert(lp_scaler != nullptr);

      for(int i = 0; i < nCols(); ++i)
      {
         R m = lp_scaler->getColMinAbsUnscaled(*this, i);

         if(m < mini)
            mini = m;
      }
   }
   else
   {
      for(int i = 0; i < nCols(); ++i)
      {
         R m = colVector(i).minAbs();

         if(m < mini)
            mini = m;
      }
   }

   assert(mini >= 0.0);

   return mini;
}